

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anonymizer.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer puVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  pointer puVar6;
  string filename;
  elfio reader;
  long *local_118;
  size_t local_110;
  long local_108 [2];
  string local_f8;
  long *local_d8;
  size_t local_d0;
  long local_c8 [2];
  elfio local_b8;
  
  if (argc == 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,argv[1],(allocator<char> *)&local_b8);
    ELFIO::elfio::elfio(&local_b8);
    bVar3 = ELFIO::elfio::load(&local_b8,&local_f8,false);
    if (bVar3) {
      puVar6 = ((local_b8.sections.parent)->sections_).
               super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = ((local_b8.sections.parent)->sections_).
               super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      iVar4 = 0;
      if (puVar6 != puVar1) {
        do {
          iVar4 = (*((puVar6->_M_t).
                     super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
                     super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->_vptr_section[5])
                            ();
          if (iVar4 == 3) {
            (*((puVar6->_M_t).
               super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>._M_t.
               super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
               super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->_vptr_section[3])
                      (&local_118);
            local_d8 = local_c8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,".strtab","");
            plVar2 = local_d8;
            if (local_110 == local_d0) {
              if (local_110 == 0) {
                bVar3 = true;
              }
              else {
                iVar4 = bcmp(local_118,local_d8,local_110);
                bVar3 = iVar4 == 0;
              }
            }
            else {
              bVar3 = false;
            }
            if (plVar2 != local_c8) {
              operator_delete(plVar2,local_c8[0] + 1);
            }
            if (local_118 != local_108) {
              operator_delete(local_118,local_108[0] + 1);
            }
            if (bVar3) {
              process_string_table
                        ((puVar6->_M_t).
                         super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                         .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl,&local_f8);
            }
          }
          puVar6 = puVar6 + 1;
          iVar4 = 0;
        } while (puVar6 != puVar1);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_f8._M_dataplus._M_p,local_f8._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," is not found or it is not an ELF file\n",0x27);
      iVar4 = 1;
    }
    ELFIO::elfio::~elfio(&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Usage: anonymizer <file_name>\n",0x1e);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int main( int argc, char** argv )
{
    if ( argc != 2 ) {
        std::cout << "Usage: anonymizer <file_name>\n";
        return 1;
    }

    std::string filename = argv[1];

    elfio reader;

    if ( !reader.load( filename ) ) {
        std::cerr << "File " << filename
                  << " is not found or it is not an ELF file\n";
        return 1;
    }

    for ( const auto& section : reader.sections ) {
        if ( section->get_type() == SHT_STRTAB &&
             std::string( section->get_name() ) == std::string( ".strtab" ) ) {
            process_string_table( section.get(), filename );
        }
    }
    return 0;
}